

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void db_compact_overwrite(void)

{
  size_t *psVar1;
  fdb_status fVar2;
  int iVar3;
  fdb_kvs_info *info;
  size_t sVar4;
  size_t sVar5;
  fdb_file_info *kvs_config;
  void *__s2;
  ulong uVar6;
  long lVar7;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar8;
  char *pcVar9;
  fdb_doc *unaff_RBP;
  fdb_doc *pfVar10;
  char *pcVar11;
  fdb_file_info *info_00;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle [8];
  uint uVar12;
  fdb_kvs_handle *unaff_R12;
  char *unaff_R13;
  fdb_kvs_handle *ptr_fhandle_00;
  fdb_config *pfVar13;
  ulong uVar14;
  __atomic_base<unsigned_long> _Var15;
  timeval tVar16;
  timeval tVar17;
  fdb_doc *rdoc;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile2;
  fdb_file_handle *dbfile;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_15288;
  undefined1 auStack_15280 [16];
  undefined1 auStack_15270 [8];
  undefined1 auStack_15268 [80];
  ulong uStack_15218;
  timeval tStack_151f8;
  fdb_file_info afStack_151e8 [3];
  fdb_file_info afStack_150e8 [3];
  fdb_config fStack_14fe8;
  fdb_kvs_handle *pfStack_14ef0;
  fdb_kvs_handle *pfStack_14ee8;
  char *pcStack_14ee0;
  fdb_config *pfStack_14ed8;
  fdb_doc **ppfStack_14ed0;
  fdb_doc *pfStack_14ec8;
  fdb_file_handle *pfStack_14eb8;
  fdb_kvs_handle *pfStack_14eb0;
  timeval tStack_14ea8;
  char acStack_14e97 [15];
  timeval tStack_14e88;
  timeval tStack_14e78;
  undefined1 auStack_14e68 [70];
  undefined1 uStack_14e22;
  undefined8 uStack_14e18;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14d58;
  fdb_kvs_handle *pfStack_14d50;
  char *pcStack_14d48;
  fdb_kvs_handle *pfStack_14d40;
  fdb_doc **ppfStack_14d38;
  fdb_doc *pfStack_14d30;
  undefined1 auStack_14d18 [16];
  fdb_kvs_handle *pfStack_14d08;
  fdb_doc *pfStack_14d00;
  fdb_kvs_handle *pfStack_14cf8;
  fdb_kvs_handle *pfStack_14cf0;
  fdb_kvs_handle *pfStack_14ce8;
  fdb_kvs_config fStack_14ce0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14cc8;
  filemgr *pfStack_14cc0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14cb8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_14cb0;
  filemgr *pfStack_14ca8;
  fdb_kvs_handle *pfStack_14ca0;
  timeval tStack_14c98;
  undefined1 auStack_14c88 [256];
  __atomic_base<unsigned_long> _Stack_14b88;
  timeval tStack_14b80;
  __atomic_base<unsigned_long> _Stack_14b70;
  fdb_doc *apfStack_14b28 [32];
  char acStack_14a28 [256];
  char acStack_14928 [256];
  fdb_doc afStack_14828 [1000];
  char acStack_fa8 [8];
  fdb_kvs_handle *pfStack_fa0;
  fdb_kvs_handle *pfStack_f98;
  char *pcStack_f90;
  fdb_kvs_handle *pfStack_f88;
  fdb_doc **ppfStack_f80;
  fdb_doc *pfStack_f78;
  fdb_kvs_handle *pfStack_f60;
  fdb_kvs_handle *pfStack_f58;
  fdb_doc *pfStack_f50;
  void *pvStack_f48;
  fdb_kvs_config fStack_f40;
  undefined1 auStack_f28 [48];
  timeval tStack_ef8;
  undefined1 auStack_ee8 [760];
  char acStack_bf0 [256];
  fdb_doc *apfStack_af0 [101];
  fdb_kvs_handle **ppfStack_7c8;
  fdb_kvs_handle *pfStack_7c0;
  char *pcStack_7b8;
  fdb_kvs_info *pfStack_7b0;
  fdb_doc **ppfStack_7a8;
  fdb_doc *pfStack_7a0;
  undefined1 local_788 [16];
  undefined1 local_778 [24];
  undefined1 local_760 [32];
  fdb_kvs_handle *local_740 [5];
  timeval local_718;
  char local_708 [256];
  fdb_doc *local_608 [31];
  fdb_config local_510;
  fdb_doc local_418 [3];
  char local_318 [256];
  fdb_kvs_info local_218 [5];
  undefined8 auStack_128 [31];
  
  pfStack_7a0 = (fdb_doc *)0x10f309;
  gettimeofday(&local_718,(__timezone_ptr_t)0x0);
  pfStack_7a0 = (fdb_doc *)0x10f30e;
  memleak_start();
  pfStack_7a0 = (fdb_doc *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_7a0 = (fdb_doc *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)local_760;
  pfStack_7a0 = (fdb_doc *)0x10f337;
  fdb_get_default_kvs_config();
  local_510.buffercache_size = 0x1000000;
  local_510.wal_threshold = 0x400;
  local_510.flags = 1;
  local_510.compaction_threshold = '\0';
  _Var15._M_i = (__int_type_conflict)(local_778 + 0x10);
  pfStack_7a0 = (fdb_doc *)0x10f369;
  fdb_open((fdb_file_handle **)_Var15._M_i,"./compact_test1",&local_510);
  ptr_handle = (fdb_kvs_handle **)local_778;
  pfStack_7a0 = (fdb_doc *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)local_778._16_8_,ptr_handle,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_7a0 = (fdb_doc *)0x10f394;
  pfVar8 = (fdb_kvs_handle *)local_778._0_8_;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_778._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar6 = 0;
    do {
      pfStack_7a0 = (fdb_doc *)0x10f3bc;
      sprintf(local_318,"key%d",uVar6 & 0xffffffff);
      pfStack_7a0 = (fdb_doc *)0x10f3d4;
      sprintf((char *)local_418,"meta%d",uVar6 & 0xffffffff);
      pfStack_7a0 = (fdb_doc *)0x10f3ec;
      sprintf(local_708,"body%d",uVar6 & 0xffffffff);
      _Var15._M_i = (long)local_608 + (long)unaff_R12;
      pfStack_7a0 = (fdb_doc *)0x10f3ff;
      unaff_R13 = (char *)strlen(local_318);
      unaff_RBP = local_418;
      pfStack_7a0 = (fdb_doc *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)unaff_RBP);
      pfStack_7a0 = (fdb_doc *)0x10f422;
      sVar4 = strlen(local_708);
      pfStack_7a0 = (fdb_doc *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var15._M_i,local_318,(size_t)unaff_R13,unaff_RBP,(size_t)info,
                     local_708,sVar4);
      pfStack_7a0 = (fdb_doc *)0x10f459;
      fdb_set((fdb_kvs_handle *)local_778._0_8_,local_608[uVar6]);
      uVar6 = uVar6 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar6 != 0x1e);
    pfStack_7a0 = (fdb_doc *)0x10f476;
    fdb_commit((fdb_file_handle *)local_778._16_8_,'\0');
    pfStack_7a0 = (fdb_doc *)0x10f492;
    fdb_open((fdb_file_handle **)(local_778 + 8),"./compact_test1.1",&local_510);
    ptr_handle = (fdb_kvs_handle **)(local_788 + 8);
    pfStack_7a0 = (fdb_doc *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)local_778._8_8_,ptr_handle,(char *)0x0,
                 (fdb_kvs_config *)local_760);
    pfStack_7a0 = (fdb_doc *)0x10f4bf;
    pfVar8 = (fdb_kvs_handle *)local_788._8_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_788._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    uVar6 = 0;
    do {
      pfStack_7a0 = (fdb_doc *)0x10f4e7;
      sprintf(local_318,"k2ey%d",uVar6 & 0xffffffff);
      pfStack_7a0 = (fdb_doc *)0x10f4ff;
      sprintf((char *)local_418,"m2eta%d",uVar6 & 0xffffffff);
      pfStack_7a0 = (fdb_doc *)0x10f517;
      sprintf(local_708,"b2ody%d",uVar6 & 0xffffffff);
      _Var15._M_i = (long)unaff_R12 + (long)&local_218[0].name;
      pfStack_7a0 = (fdb_doc *)0x10f52a;
      unaff_R13 = (char *)strlen(local_318);
      unaff_RBP = local_418;
      pfStack_7a0 = (fdb_doc *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)unaff_RBP);
      pfStack_7a0 = (fdb_doc *)0x10f54d;
      sVar4 = strlen(local_708);
      pfStack_7a0 = (fdb_doc *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var15._M_i,local_318,(size_t)unaff_R13,unaff_RBP,(size_t)info,
                     local_708,sVar4);
      pfStack_7a0 = (fdb_doc *)0x10f584;
      fdb_set((fdb_kvs_handle *)local_788._8_8_,(fdb_doc *)(&local_218[0].name)[uVar6]);
      uVar6 = uVar6 + 1;
      unaff_R12 = (fdb_kvs_handle *)((long)unaff_R12 + 8);
    } while (uVar6 != 0x3c);
    pfStack_7a0 = (fdb_doc *)0x10f5a1;
    fdb_commit((fdb_file_handle *)local_778._8_8_,'\0');
    pfStack_7a0 = (fdb_doc *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)local_788._8_8_,(fdb_kvs_info *)(local_760 + 0x18));
    ptr_handle = local_740;
    if (local_740[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_7a0 = (fdb_doc *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_7a0 = (fdb_doc *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)local_788._8_8_);
    pfStack_7a0 = (fdb_doc *)0x10f5d7;
    fdb_close((fdb_file_handle *)local_778._8_8_);
    pfStack_7a0 = (fdb_doc *)0x10f5e3;
    pfVar8 = (fdb_kvs_handle *)local_778._16_8_;
    fVar2 = fdb_compact((fdb_file_handle *)local_778._16_8_,(char *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)local_778;
    pfStack_7a0 = (fdb_doc *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)local_778._0_8_);
    _Var15._M_i = (__int_type_conflict)(local_778 + 0x10);
    pfStack_7a0 = (fdb_doc *)0x10f605;
    fdb_close((fdb_file_handle *)local_778._16_8_);
    pfStack_7a0 = (fdb_doc *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var15._M_i,"./compact_test1",&local_510);
    pfStack_7a0 = (fdb_doc *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)local_778._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)local_760);
    pfStack_7a0 = (fdb_doc *)0x10f644;
    pfVar8 = (fdb_kvs_handle *)local_778._0_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_778._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)local_788;
    do {
      pfStack_7a0 = (fdb_doc *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)local_608 + (long)unaff_R12))[4],
                     **(size_t **)((long)local_608 + (long)unaff_R12),(void *)0x0,0,(void *)0x0,0);
      pfStack_7a0 = (fdb_doc *)0x10f68a;
      pfVar8 = (fdb_kvs_handle *)local_778._0_8_;
      fVar2 = fdb_get((fdb_kvs_handle *)local_778._0_8_,(fdb_doc *)local_788._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_7a0 = (fdb_doc *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var15._M_i = (long)local_608 + (long)unaff_R12;
      pfStack_7a0 = (fdb_doc *)0x10f6b6;
      iVar3 = bcmp(*(btree **)(local_788._0_8_ + 0x38),(*(fdb_doc **)_Var15._M_i)->meta,
                   (size_t)((fdb_kvs_config *)local_788._0_8_)->custom_cmp);
      if (iVar3 != 0) {
        pfStack_7a0 = (fdb_doc *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_7a0 = (fdb_doc *)0x10f6d3;
      iVar3 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_788._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var15._M_i)->body,
                   (size_t)((fdb_kvs_config *)local_788._0_8_)->custom_cmp_param);
      if (iVar3 != 0) {
        pfStack_7a0 = (fdb_doc *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_7a0 = (fdb_doc *)0x10f6e1;
      fdb_doc_free((fdb_doc *)local_788._0_8_);
      unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).custom_cmp;
    } while (unaff_R12 != (fdb_kvs_handle *)0xf0);
    pfStack_7a0 = (fdb_doc *)0x10f72a;
    fdb_open((fdb_file_handle **)(local_778 + 8),"./compact_test1.1",&local_510);
    info = (fdb_kvs_info *)(local_788 + 8);
    pfStack_7a0 = (fdb_doc *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)local_778._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)local_760);
    pfStack_7a0 = (fdb_doc *)0x10f757;
    pfVar8 = (fdb_kvs_handle *)local_788._8_8_;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)local_788._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar2 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(local_760 + 0x18);
      pfStack_7a0 = (fdb_doc *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)local_788._8_8_,info);
      if (local_740[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_7a0 = (fdb_doc *)0x10f780;
        db_compact_overwrite();
      }
      _Var15._M_i = 0;
      ptr_handle = (fdb_kvs_handle **)local_788;
      while( true ) {
        psVar1 = *(size_t **)((long)&local_218[0].name + _Var15._M_i);
        pfStack_7a0 = (fdb_doc *)0x10f7af;
        fdb_doc_create((fdb_doc **)ptr_handle,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0)
        ;
        pfStack_7a0 = (fdb_doc *)0x10f7be;
        pfVar8 = (fdb_kvs_handle *)local_788._8_8_;
        fVar2 = fdb_get((fdb_kvs_handle *)local_788._8_8_,(fdb_doc *)local_788._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)((long)&local_218[0].name + _Var15._M_i);
        pfStack_7a0 = (fdb_doc *)0x10f7ea;
        iVar3 = bcmp(*(btree **)(local_788._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)local_788._0_8_)->custom_cmp);
        if (iVar3 != 0) {
          pfStack_7a0 = (fdb_doc *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_7a0 = (fdb_doc *)0x10f807;
        iVar3 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_788._0_8_ + 0x40))->
                     seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)local_788._0_8_)->custom_cmp_param);
        if (iVar3 != 0) {
          pfStack_7a0 = (fdb_doc *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_7a0 = (fdb_doc *)0x10f815;
        fdb_doc_free((fdb_doc *)local_788._0_8_);
        _Var15._M_i = _Var15._M_i + 8;
        if ((fdb_doc **)_Var15._M_i == (fdb_doc **)0x1e0) {
          lVar7 = 0;
          do {
            pfStack_7a0 = (fdb_doc *)0x10f851;
            fdb_doc_free(local_608[lVar7]);
            pfStack_7a0 = (fdb_doc *)0x10f85e;
            fdb_doc_free((fdb_doc *)(&local_218[0].name)[lVar7]);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x1e);
          lVar7 = 0;
          do {
            pfStack_7a0 = (fdb_doc *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_128[lVar7]);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x1e);
          pfStack_7a0 = (fdb_doc *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)local_778._0_8_);
          pfStack_7a0 = (fdb_doc *)0x10f893;
          fdb_close((fdb_file_handle *)local_778._16_8_);
          pfStack_7a0 = (fdb_doc *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)local_788._8_8_);
          pfStack_7a0 = (fdb_doc *)0x10f8a7;
          fdb_close((fdb_file_handle *)local_778._8_8_);
          pfStack_7a0 = (fdb_doc *)0x10f8ac;
          fdb_shutdown();
          pfStack_7a0 = (fdb_doc *)0x10f8b1;
          memleak_end();
          pcVar11 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar11 = "%s FAILED\n";
          }
          pfStack_7a0 = (fdb_doc *)0x10f8e2;
          fprintf(_stderr,pcVar11,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_7a0 = (fdb_doc *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_7a0 = (fdb_doc *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_7a0 = (fdb_doc *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_7a0 = (fdb_doc *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_7a0 = (fdb_doc *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_7a0 = (fdb_doc *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_f78 = (fdb_doc *)0x10f937;
  ppfStack_7c8 = ptr_handle;
  pfStack_7c0 = unaff_R12;
  pcStack_7b8 = unaff_R13;
  pfStack_7b0 = info;
  ppfStack_7a8 = (fdb_doc **)_Var15._M_i;
  pfStack_7a0 = unaff_RBP;
  gettimeofday(&tStack_ef8,(__timezone_ptr_t)0x0);
  pfStack_f78 = (fdb_doc *)0x10f93c;
  memleak_start();
  pfStack_f78 = (fdb_doc *)0x10f946;
  fdb_get_default_kvs_config();
  ptr_fhandle_00 = (fdb_kvs_handle *)auStack_ee8;
  pfStack_f78 = (fdb_doc *)0x10f956;
  fdb_get_default_config();
  auStack_ee8._8_8_ = (list *)0x0;
  auStack_ee8._16_8_ = (list *)0x400;
  auStack_ee8[0x2f] = '\0';
  if (pfVar8 == (fdb_kvs_handle *)0x0) {
    pfStack_f78 = (fdb_doc *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_f60;
    pfStack_f78 = (fdb_doc *)0x10f999;
    fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_ee8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_f78 = (fdb_doc *)0x10f9b5;
      ptr_fhandle = pfStack_f60;
      fVar2 = fdb_kvs_open_default((fdb_file_handle *)pfStack_f60,&pfStack_f58,&fStack_f40);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar7 = 0;
      uVar6 = 0;
      do {
        pfStack_f78 = (fdb_doc *)0x10f9dd;
        sprintf(acStack_bf0,"key%d",uVar6 & 0xffffffff);
        pfStack_f78 = (fdb_doc *)0x10f9f5;
        sprintf(auStack_ee8 + 0x1f8,"meta%d",uVar6 & 0xffffffff);
        pfStack_f78 = (fdb_doc *)0x10fa0d;
        sprintf(auStack_ee8 + 0xf8,"body%d",uVar6 & 0xffffffff);
        pfStack_f78 = (fdb_doc *)0x10fa20;
        unaff_R13 = (char *)strlen(acStack_bf0);
        unaff_RBP = (fdb_doc *)(auStack_ee8 + 0x1f8);
        pfStack_f78 = (fdb_doc *)0x10fa33;
        sVar4 = strlen((char *)unaff_RBP);
        pfStack_f78 = (fdb_doc *)0x10fa43;
        sVar5 = strlen(auStack_ee8 + 0xf8);
        pfStack_f78 = (fdb_doc *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_af0 + lVar7),acStack_bf0,(size_t)unaff_R13,
                       unaff_RBP,sVar4,auStack_ee8 + 0xf8,sVar5);
        pfStack_f78 = (fdb_doc *)0x10fa7a;
        fdb_set(pfStack_f58,apfStack_af0[uVar6]);
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 8;
      } while (uVar6 != 100);
      pfStack_f78 = (fdb_doc *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_f60,'\0');
      pfStack_f78 = (fdb_doc *)0x10faa6;
      fdb_get_kvs_info(pfStack_f58,(fdb_kvs_info *)auStack_f28);
      pfVar8 = (fdb_kvs_handle *)(auStack_f28 + 0x10);
      if ((filemgr *)auStack_f28._16_8_ != (filemgr *)0x64) {
        pfStack_f78 = (fdb_doc *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar7 = 0;
      _Var15._M_i = (__int_type_conflict)&pfStack_f50;
      do {
        pfStack_f78 = (fdb_doc *)0x10fada;
        fdb_del(pfStack_f58,apfStack_af0[lVar7]);
        if (lVar7 == 0x32) {
          pfStack_f78 = (fdb_doc *)0x10faf2;
          pthread_create((pthread_t *)_Var15._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_f60);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 100);
      pfStack_f78 = (fdb_doc *)0x10fb0a;
      pthread_join((pthread_t)pfStack_f50,&pvStack_f48);
      pfStack_f78 = (fdb_doc *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_f60,'\x01');
      pfStack_f78 = (fdb_doc *)0x10fb2b;
      fdb_get_kvs_info(pfStack_f58,(fdb_kvs_info *)auStack_f28);
      if ((filemgr *)auStack_f28._16_8_ != (filemgr *)0x0) {
        pfStack_f78 = (fdb_doc *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_f78 = (fdb_doc *)0x10fb44;
      fdb_kvs_close(pfStack_f58);
      ptr_fhandle_00 = (fdb_kvs_handle *)&pfStack_f60;
      pfStack_f78 = (fdb_doc *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_f60);
      pfStack_f78 = (fdb_doc *)0x10fb68;
      ptr_fhandle = ptr_fhandle_00;
      fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",
                       (fdb_config *)auStack_ee8);
      unaff_R12 = (fdb_kvs_handle *)0x64;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_f78 = (fdb_doc *)0x10fb84;
      ptr_fhandle = pfStack_f60;
      fVar2 = fdb_kvs_open_default((fdb_file_handle *)pfStack_f60,&pfStack_f58,&fStack_f40);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_f78 = (fdb_doc *)0x10fb9e;
        fdb_get_kvs_info(pfStack_f58,(fdb_kvs_info *)auStack_f28);
        if ((filemgr *)auStack_f28._16_8_ != (filemgr *)0x0) {
          pfStack_f78 = (fdb_doc *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar7 = 0;
        do {
          pfStack_f78 = (fdb_doc *)0x10fbbc;
          fdb_doc_free(apfStack_af0[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 100);
        pfStack_f78 = (fdb_doc *)0x10fbcf;
        fdb_kvs_close(pfStack_f58);
        pfStack_f78 = (fdb_doc *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_f60);
        pfStack_f78 = (fdb_doc *)0x10fbde;
        fdb_shutdown();
        pfStack_f78 = (fdb_doc *)0x10fbe3;
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        pfStack_f78 = (fdb_doc *)0x10fc14;
        fprintf(_stderr,pcVar11,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_f78 = (fdb_doc *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_f78 = (fdb_doc *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_f78 = (fdb_doc *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_f78 = (fdb_doc *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_f78 = (fdb_doc *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_f60;
    pfStack_f78 = (fdb_doc *)0x10fc41;
    fVar2 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_ee8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_f78 = (fdb_doc *)0x10fc51;
    ptr_fhandle = pfStack_f60;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_f60,(char *)0x0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_f78 = (fdb_doc *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_f60);
      pfStack_f78 = (fdb_doc *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_f78 = (fdb_doc *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar9 = (char *)0x0;
  pfStack_14d30 = (fdb_doc *)0x10fcab;
  pfStack_14ce8 = ptr_fhandle;
  pfStack_fa0 = pfVar8;
  pfStack_f98 = unaff_R12;
  pcStack_f90 = unaff_R13;
  pfStack_f88 = ptr_fhandle_00;
  ppfStack_f80 = (fdb_doc **)_Var15._M_i;
  pfStack_f78 = unaff_RBP;
  gettimeofday(&tStack_14b80,(__timezone_ptr_t)0x0);
  pfStack_14d30 = (fdb_doc *)0x10fcb0;
  memleak_start();
  pfStack_14d30 = (fdb_doc *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar8 = (fdb_kvs_handle *)auStack_14c88;
  pfStack_14d30 = (fdb_doc *)0x10fccc;
  fdb_get_default_config();
  pfStack_14d30 = (fdb_doc *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_14c88._8_8_ = (kvs_ops_stat *)0x0;
  auStack_14c88._16_8_ = (fdb_file_handle *)0x400;
  auStack_14c88._36_4_ = 1;
  auStack_14c88._46_2_ = 0x1e01;
  auStack_14c88._56_8_ = (docio_handle *)0x1;
  auStack_14c88._120_8_ = 0;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x10fd11;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test",(fdb_config *)pfVar8);
  if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_0011080b;
  auStack_14c88._120_8_ = 4;
  pfStack_14d30 = (fdb_doc *)0x10fd3e;
  fdb_open((fdb_file_handle **)auStack_14d18,"compact_test",(fdb_config *)auStack_14c88);
  pfVar8 = (fdb_kvs_handle *)(auStack_14d18 + 8);
  pfStack_14d30 = (fdb_doc *)0x10fd53;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_14d18._0_8_,(fdb_kvs_handle **)pfVar8,&fStack_14ce0);
  pfStack_14d30 = (fdb_doc *)0x10fd69;
  pcVar11 = (char *)auStack_14d18._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110810;
  pfStack_14d30 = (fdb_doc *)0x10fd7d;
  puts("Initialize..");
  pcVar9 = (char *)0x0;
  uVar6 = 0;
  do {
    pfStack_14d30 = (fdb_doc *)0x10fd9e;
    sprintf((char *)apfStack_14b28,"key%04d",uVar6 & 0xffffffff);
    pfStack_14d30 = (fdb_doc *)0x10fdba;
    sprintf(acStack_14a28,"meta%04d",uVar6 & 0xffffffff);
    pfStack_14d30 = (fdb_doc *)0x10fdd6;
    sprintf(acStack_14928,"body%04d",uVar6 & 0xffffffff);
    unaff_RBP = (fdb_doc *)((long)&afStack_14828[0].keylen + (long)pcVar9);
    pfStack_14d30 = (fdb_doc *)0x10fde9;
    sVar4 = strlen((char *)apfStack_14b28);
    _Var15._M_i = sVar4 + 1;
    pfStack_14d30 = (fdb_doc *)0x10fdf5;
    sVar4 = strlen(acStack_14a28);
    unaff_R13 = (char *)(sVar4 + 1);
    pfStack_14d30 = (fdb_doc *)0x10fe01;
    sVar4 = strlen(acStack_14928);
    pfStack_14d30 = (fdb_doc *)0x10fe29;
    fdb_doc_create((fdb_doc **)unaff_RBP,apfStack_14b28,_Var15._M_i,acStack_14a28,(size_t)unaff_R13,
                   acStack_14928,sVar4 + 1);
    pfStack_14d30 = (fdb_doc *)0x10fe3b;
    fdb_set((fdb_kvs_handle *)auStack_14d18._8_8_,(fdb_doc *)(&afStack_14828[0].keylen)[uVar6]);
    uVar6 = uVar6 + 1;
    pcVar9 = (char *)((long)pcVar9 + 8);
  } while (uVar6 != 10000);
  pfVar8 = (fdb_kvs_handle *)auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x10fe5e;
  fdb_commit((fdb_file_handle *)auStack_14d18._0_8_,'\0');
  pfStack_14d30 = (fdb_doc *)0x10fe66;
  fdb_close((fdb_file_handle *)auStack_14d18._0_8_);
  pfStack_14d30 = (fdb_doc *)0x10fe7d;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test",(fdb_config *)auStack_14c88);
  unaff_R12 = (fdb_kvs_handle *)0x2710;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110815;
  pfStack_14d30 = (fdb_doc *)0x10fe99;
  pcVar11 = (char *)auStack_14d18._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d18._0_8_,(fdb_kvs_handle **)(auStack_14d18 + 8),
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
  pfStack_14d30 = (fdb_doc *)0x10feb9;
  pcVar11 = (char *)auStack_14d18._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
  pfVar8 = (fdb_kvs_handle *)&_Stack_14b70;
  pfStack_14d30 = (fdb_doc *)0x10fed6;
  fdb_get_file_info((fdb_file_handle *)auStack_14d18._0_8_,(fdb_file_info *)pfVar8);
  pfStack_14d30 = (fdb_doc *)0x10fee5;
  iVar3 = strcmp((char *)_Stack_14b70._M_i,"compact_test");
  if (iVar3 != 0) {
    pfStack_14d30 = (fdb_doc *)0x10fef6;
    compaction_daemon_test();
  }
  pcVar9 = "key%04d";
  _Var15._M_i = (__int_type_conflict)apfStack_14b28;
  unaff_R13 = (char *)0x0;
  pfVar10 = unaff_RBP;
  do {
    pfStack_14d30 = (fdb_doc *)0x10ff18;
    sprintf((char *)_Var15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_14d30 = (fdb_doc *)0x10ff20;
    sVar4 = strlen((char *)_Var15._M_i);
    pfStack_14d30 = (fdb_doc *)0x10ff41;
    fdb_doc_create(&pfStack_14d00,(void *)_Var15._M_i,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14d30 = (fdb_doc *)0x10ff50;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_14d18._8_8_,pfStack_14d00);
    unaff_RBP = pfStack_14d00;
    if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
      pfStack_14d30 = (fdb_doc *)0x1107eb;
      compaction_daemon_test();
      goto LAB_001107eb;
    }
    pfVar8 = (fdb_kvs_handle *)pfStack_14d00->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_14828[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_14d30 = (fdb_doc *)0x10ff7c;
    iVar3 = bcmp(pfVar8,unaff_R12,pfStack_14d00->bodylen);
    pfVar10 = unaff_RBP;
    if (iVar3 != 0) {
      pfStack_14d30 = (fdb_doc *)0x1107e6;
      compaction_daemon_test();
      goto LAB_001107e6;
    }
    pfStack_14d30 = (fdb_doc *)0x10ff8c;
    fdb_doc_free(unaff_RBP);
    unaff_R13 = unaff_R13 + 1;
  } while (unaff_R13 != (char *)0x2710);
  pfStack_14d30 = (fdb_doc *)0x10ffb0;
  pcVar11 = (char *)auStack_14d18._8_8_;
  fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_14d18._8_8_,(fdb_kvs_handle **)&pfStack_14cc0,
                            10000);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110824;
  pfStack_14d30 = (fdb_doc *)0x10ffc2;
  fdb_kvs_close((fdb_kvs_handle *)pfStack_14cc0);
  pfVar8 = (fdb_kvs_handle *)auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x10ffcf;
  fdb_close((fdb_file_handle *)auStack_14d18._0_8_);
  pfStack_14d30 = (fdb_doc *)0x10ffdb;
  system("rm -rf  compact_test.meta > errorlog.txt");
  pfStack_14d30 = (fdb_doc *)0x10fff2;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110829;
  pfStack_14d30 = (fdb_doc *)0x11000e;
  pcVar11 = (char *)auStack_14d18._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d18._0_8_,(fdb_kvs_handle **)(auStack_14d18 + 8),
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
  pfStack_14d30 = (fdb_doc *)0x11002e;
  pcVar11 = (char *)auStack_14d18._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110833;
  pcVar9 = "key%04d";
  _Var15._M_i = (__int_type_conflict)apfStack_14b28;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_14d30 = (fdb_doc *)0x110058;
    sprintf((char *)_Var15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_14d30 = (fdb_doc *)0x110060;
    sVar4 = strlen((char *)_Var15._M_i);
    pfStack_14d30 = (fdb_doc *)0x110081;
    fdb_doc_create(&pfStack_14d00,(void *)_Var15._M_i,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14d30 = (fdb_doc *)0x110090;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_14d18._8_8_,pfStack_14d00);
    pfVar10 = pfStack_14d00;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
    pfVar8 = (fdb_kvs_handle *)pfStack_14d00->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_14828[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_14d30 = (fdb_doc *)0x1100bc;
    iVar3 = bcmp(pfVar8,unaff_R12,pfStack_14d00->bodylen);
    if (iVar3 != 0) goto LAB_001107eb;
    pfStack_14d30 = (fdb_doc *)0x1100cc;
    fdb_doc_free(pfVar10);
    unaff_R13 = unaff_R13 + 1;
    unaff_RBP = pfVar10;
  } while (unaff_R13 != (char *)0x2710);
  pfVar8 = (fdb_kvs_handle *)auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x1100e9;
  fdb_close((fdb_file_handle *)auStack_14d18._0_8_);
  pfStack_14d30 = (fdb_doc *)0x1100f5;
  system("mv  compact_test.0 compact_test.23 > errorlog.txt");
  pfStack_14d30 = (fdb_doc *)0x11010c;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110838;
  pfStack_14d30 = (fdb_doc *)0x110128;
  pcVar11 = (char *)auStack_14d18._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d18._0_8_,(fdb_kvs_handle **)(auStack_14d18 + 8),
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
  pfStack_14d30 = (fdb_doc *)0x110148;
  pcVar11 = (char *)auStack_14d18._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110842;
  pcVar9 = "key%04d";
  _Var15._M_i = (__int_type_conflict)apfStack_14b28;
  unaff_R13 = (char *)0x0;
  do {
    pfStack_14d30 = (fdb_doc *)0x110172;
    sprintf((char *)_Var15._M_i,"key%04d",(ulong)unaff_R13 & 0xffffffff);
    pfStack_14d30 = (fdb_doc *)0x11017a;
    sVar4 = strlen((char *)_Var15._M_i);
    pfStack_14d30 = (fdb_doc *)0x11019b;
    fdb_doc_create(&pfStack_14d00,(void *)_Var15._M_i,sVar4 + 1,(void *)0x0,0,(void *)0x0,0);
    pfStack_14d30 = (fdb_doc *)0x1101aa;
    pcVar11 = (char *)auStack_14d18._8_8_;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_14d18._8_8_,pfStack_14d00);
    pfVar10 = pfStack_14d00;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110806;
    pfVar8 = (fdb_kvs_handle *)pfStack_14d00->body;
    unaff_R12 = *(fdb_kvs_handle **)((&afStack_14828[0].keylen)[(long)unaff_R13] + 0x40);
    pfStack_14d30 = (fdb_doc *)0x1101d6;
    iVar3 = bcmp(pfVar8,unaff_R12,pfStack_14d00->bodylen);
    if (iVar3 != 0) goto LAB_001107fb;
    pfStack_14d30 = (fdb_doc *)0x1101e6;
    fdb_doc_free(pfVar10);
    unaff_R13 = unaff_R13 + 1;
    unaff_RBP = pfVar10;
  } while (unaff_R13 != (char *)0x2710);
  pfStack_14d30 = (fdb_doc *)0x110200;
  fdb_close((fdb_file_handle *)auStack_14d18._0_8_);
  pcVar11 = (char *)&pfStack_14cf0;
  pfStack_14d30 = (fdb_doc *)0x110219;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_less",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110847;
  pfStack_14d30 = (fdb_doc *)0x110238;
  pcVar11 = (char *)pfStack_14cf0;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_14cf0,(fdb_kvs_handle **)&pfStack_14ca8,
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
  auStack_14c88._46_2_ = auStack_14c88._46_2_ & 0xff;
  pcVar11 = (char *)&pfStack_14cf8;
  pfStack_14d30 = (fdb_doc *)0x11025d;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110851;
  pfStack_14d30 = (fdb_doc *)0x110279;
  pcVar11 = (char *)pfStack_14cf8;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_14cf8,(fdb_kvs_handle **)&aStack_14cb0.seqtree,
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110856;
  auStack_14c88._46_2_ = auStack_14c88._46_2_ & 0xff00;
  pcVar11 = (char *)&pfStack_14d08;
  pfStack_14d30 = (fdb_doc *)0x11029e;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
  pfStack_14d30 = (fdb_doc *)0x1102ba;
  pcVar11 = (char *)pfStack_14d08;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_14d08,(fdb_kvs_handle **)&aStack_14cb8.seqtree,
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110860;
  auStack_14c88._46_2_ = 0x1e01;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x1102e1;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110865;
  pfStack_14d30 = (fdb_doc *)0x1102fd;
  pcVar11 = (char *)auStack_14d18._0_8_;
  fVar2 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_14d18._0_8_,(fdb_kvs_handle **)(auStack_14d18 + 8),
                     &fStack_14ce0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
  pfStack_14d30 = (fdb_doc *)0x11031d;
  pcVar11 = (char *)auStack_14d18._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_14d18._8_8_,logCallbackFunc,"compaction_daemon_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
  pcVar9 = (char *)0x0;
  pfStack_14d30 = (fdb_doc *)0x11033a;
  printf("wait for %d seconds..\n");
  pfStack_14d30 = (fdb_doc *)0x11034c;
  gettimeofday((timeval *)(auStack_14c88 + 0xf8),(__timezone_ptr_t)0x0);
  tVar17.tv_usec = _Stack_14b88._M_i;
  tVar17.tv_sec = auStack_14c88._248_8_;
  do {
    pfVar10 = (fdb_doc *)0xfffffffffffec780;
    unaff_R13 = (char *)0x0;
    iVar3 = 0;
    aStack_14cc8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
    do {
      pfStack_14d30 = (fdb_doc *)0x110388;
      fdb_set((fdb_kvs_handle *)auStack_14d18._8_8_,*(fdb_doc **)(acStack_fa8 + (long)pfVar10));
      pfStack_14d30 = (fdb_doc *)0x110394;
      fdb_commit((fdb_file_handle *)auStack_14d18._0_8_,'\0');
      uVar12 = (int)((ulong)unaff_R13 / 100) * 100 + iVar3;
      unaff_R12 = (fdb_kvs_handle *)(ulong)uVar12;
      if (uVar12 == 0) {
        pfStack_14d30 = (fdb_doc *)0x1103ae;
        fdb_set((fdb_kvs_handle *)pfStack_14ca8,*(fdb_doc **)(acStack_fa8 + (long)pfVar10));
        pfStack_14d30 = (fdb_doc *)0x1103ba;
        fdb_commit((fdb_file_handle *)pfStack_14cf0,'\0');
      }
      pfStack_14d30 = (fdb_doc *)0x1103cc;
      fdb_set((fdb_kvs_handle *)aStack_14cb0.seqtree,*(fdb_doc **)(acStack_fa8 + (long)pfVar10));
      pfStack_14d30 = (fdb_doc *)0x1103d8;
      fdb_commit((fdb_file_handle *)pfStack_14cf8,'\0');
      pfStack_14d30 = (fdb_doc *)0x1103ea;
      fdb_set((fdb_kvs_handle *)aStack_14cb8.seqtree,*(fdb_doc **)(acStack_fa8 + (long)pfVar10));
      pfStack_14d30 = (fdb_doc *)0x1103f6;
      fdb_commit((fdb_file_handle *)pfStack_14d08,'\0');
      pfStack_14d30 = (fdb_doc *)0x110405;
      gettimeofday((timeval *)&tStack_14c98,(__timezone_ptr_t)0x0);
      pfStack_14d30 = (fdb_doc *)0x110420;
      tVar16 = _utime_gap(tVar17,tStack_14c98);
      if (pfStack_14ce8 <= (fdb_kvs_handle *)tVar16.tv_sec) {
        pcVar9 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
        break;
      }
      iVar3 = iVar3 + -1;
      unaff_R13 = (char *)(ulong)((int)unaff_R13 + 1);
      pfVar10 = (fdb_doc *)&pfVar10->metalen;
      pcVar9 = (char *)aStack_14cc8;
    } while (pfVar10 != (fdb_doc *)0x0);
  } while ((int)pcVar9 == 0);
  pfStack_14d30 = (fdb_doc *)0x110459;
  pcVar11 = (char *)auStack_14d18._0_8_;
  fVar2 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14d18._0_8_,0x3c);
  pfVar8 = (fdb_kvs_handle *)auStack_14c88._248_8_;
  _Var15._M_i = _Stack_14b88._M_i;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110874;
  pfStack_14d30 = (fdb_doc *)0x110470;
  pcVar11 = (char *)auStack_14d18._0_8_;
  fVar2 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_14d18._0_8_,1);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110879;
  pfStack_14d30 = (fdb_doc *)0x110484;
  pcVar11 = (char *)pfStack_14cf8;
  fVar2 = fdb_compact((fdb_file_handle *)pfStack_14cf8,(char *)0x0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
  pfStack_14d30 = (fdb_doc *)0x11049d;
  pcVar11 = (char *)pfStack_14d08;
  fVar2 = fdb_compact((fdb_file_handle *)pfStack_14d08,"compact_test_manual_compacted");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110883;
  auStack_14c88._46_2_ = auStack_14c88._46_2_ & 0xff00;
  pcVar11 = (char *)&pfStack_14ca0;
  pfStack_14d30 = (fdb_doc *)0x1104c5;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                   (fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110888;
  pfStack_14d30 = (fdb_doc *)0x1104e1;
  pcVar11 = (char *)pfStack_14d08;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14d08,'\x01',0x1e);
  if (fVar2 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
  pfStack_14d30 = (fdb_doc *)0x1104f7;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_14ca0);
  pcVar11 = (char *)pfStack_14ca0;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110892;
  pfStack_14d30 = (fdb_doc *)0x110513;
  pcVar11 = (char *)pfStack_14d08;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14d08,'\x01',10);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110897;
  pfStack_14d30 = (fdb_doc *)0x11052f;
  pcVar11 = (char *)pfStack_14d08;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14d08,'\x01',0x1e);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
  pfStack_14d30 = (fdb_doc *)0x110541;
  pcVar11 = (char *)pfStack_14d08;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_14d08);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
  auStack_14c88[0x2e] = 1;
  pcVar11 = (char *)&pfStack_14d08;
  pfStack_14d30 = (fdb_doc *)0x110566;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                   (fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
  pfStack_14d30 = (fdb_doc *)0x11057c;
  pcVar11 = (char *)pfStack_14cf8;
  fVar2 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_14cf8,'\0',0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
  pfStack_14d30 = (fdb_doc *)0x11058e;
  pcVar11 = (char *)pfStack_14cf8;
  fVar2 = fdb_close((fdb_file_handle *)pfStack_14cf8);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
  auStack_14c88._46_2_ = auStack_14c88._46_2_ & 0xff00;
  pcVar11 = (char *)&pfStack_14cf8;
  pfStack_14d30 = (fdb_doc *)0x1105b3;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
  pcVar9 = "compact_test_non.manual";
  pfStack_14d30 = (fdb_doc *)0x1105cf;
  fdb_compact((fdb_file_handle *)pfStack_14cf8,"compact_test_non.manual");
  pfVar8 = (fdb_kvs_handle *)auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x1105dc;
  fdb_close((fdb_file_handle *)auStack_14d18._0_8_);
  pfStack_14d30 = (fdb_doc *)0x1105e6;
  fdb_close((fdb_file_handle *)pfStack_14cf0);
  pfStack_14d30 = (fdb_doc *)0x1105f0;
  fdb_close((fdb_file_handle *)pfStack_14d08);
  auStack_14c88[0x2e] = 1;
  pfStack_14d30 = (fdb_doc *)0x110607;
  pcVar11 = (char *)pfVar8;
  fVar2 = fdb_open((fdb_file_handle **)pfVar8,"compact_test_non.manual",(fdb_config *)auStack_14c88)
  ;
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
  pcVar11 = "compact_test_non.manual";
  pfStack_14d30 = (fdb_doc *)0x110624;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
  auStack_14c88._46_2_ = auStack_14c88._46_2_ & 0xff00;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x11064a;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_manual_compacted",
                   (fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
  pcVar11 = "compact_test_manual_compacted";
  pfStack_14d30 = (fdb_doc *)0x110667;
  fVar2 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
  auStack_14c88[0x2e] = 1;
  pcVar11 = "compact_test_manual_compacted";
  pfStack_14d30 = (fdb_doc *)0x110688;
  fVar2 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
  auStack_14c88._46_2_ = auStack_14c88._46_2_ & 0xff00;
  pcVar11 = "compact_test_non.manual";
  pfStack_14d30 = (fdb_doc *)0x1106a8;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
  pfStack_14d30 = (fdb_doc *)0x1106bb;
  fdb_close((fdb_file_handle *)pfStack_14cf8);
  pfStack_14d30 = (fdb_doc *)0x1106c0;
  fVar2 = fdb_shutdown();
  pcVar11 = (char *)pfStack_14cf8;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
  pcVar11 = "compact_test_non.manual";
  pfStack_14d30 = (fdb_doc *)0x1106dc;
  fVar2 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
  auStack_14c88._36_4_ = 2;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x110704;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"./compact_test_manual_compacted",
                   (fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x110726;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"./compact_test_manual_compacted.meta",
                   (fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x110748;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non",(fdb_config *)auStack_14c88);
  if (fVar2 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
  pcVar11 = auStack_14d18;
  pfStack_14d30 = (fdb_doc *)0x11076a;
  fVar2 = fdb_open((fdb_file_handle **)pcVar11,"compact_test_non.manual",(fdb_config *)auStack_14c88
                  );
  if (fVar2 == FDB_RESULT_NO_SUCH_FILE) {
    lVar7 = 0;
    do {
      pfStack_14d30 = (fdb_doc *)0x110782;
      fdb_doc_free((fdb_doc *)(&afStack_14828[0].keylen)[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 10000);
    pfStack_14d30 = (fdb_doc *)0x110793;
    fdb_shutdown();
    pfStack_14d30 = (fdb_doc *)0x110798;
    memleak_end();
    pcVar11 = "%s PASSED\n";
    if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
      pcVar11 = "%s FAILED\n";
    }
    pfStack_14d30 = (fdb_doc *)0x1107c9;
    fprintf(_stderr,pcVar11,"compaction daemon test");
    return;
  }
  goto LAB_001108f1;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
LAB_001107eb:
  pfStack_14d30 = (fdb_doc *)0x1107f6;
  compaction_daemon_test();
  unaff_RBP = pfVar10;
LAB_001107f6:
  pfVar10 = unaff_RBP;
  pfStack_14d30 = (fdb_doc *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_14d30 = (fdb_doc *)0x110806;
  pcVar11 = (char *)unaff_R12;
  compaction_daemon_test();
  unaff_RBP = pfVar10;
LAB_00110806:
  _Var15._M_i = (__int_type_conflict)apfStack_14b28;
  pcVar9 = "key%04d";
  pfStack_14d30 = (fdb_doc *)0x11080b;
  compaction_daemon_test();
LAB_0011080b:
  pfStack_14d30 = (fdb_doc *)0x110810;
  compaction_daemon_test();
LAB_00110810:
  pfStack_14d30 = (fdb_doc *)0x110815;
  compaction_daemon_test();
LAB_00110815:
  pfStack_14d30 = (fdb_doc *)0x11081a;
  compaction_daemon_test();
LAB_0011081a:
  pfStack_14d30 = (fdb_doc *)0x11081f;
  compaction_daemon_test();
LAB_0011081f:
  pfStack_14d30 = (fdb_doc *)0x110824;
  compaction_daemon_test();
LAB_00110824:
  pfStack_14d30 = (fdb_doc *)0x110829;
  compaction_daemon_test();
LAB_00110829:
  pfStack_14d30 = (fdb_doc *)0x11082e;
  compaction_daemon_test();
LAB_0011082e:
  pfStack_14d30 = (fdb_doc *)0x110833;
  compaction_daemon_test();
  pfVar10 = unaff_RBP;
LAB_00110833:
  pfStack_14d30 = (fdb_doc *)0x110838;
  compaction_daemon_test();
LAB_00110838:
  pfStack_14d30 = (fdb_doc *)0x11083d;
  compaction_daemon_test();
LAB_0011083d:
  pfStack_14d30 = (fdb_doc *)0x110842;
  compaction_daemon_test();
LAB_00110842:
  pfStack_14d30 = (fdb_doc *)0x110847;
  compaction_daemon_test();
LAB_00110847:
  pfStack_14d30 = (fdb_doc *)0x11084c;
  compaction_daemon_test();
LAB_0011084c:
  pfStack_14d30 = (fdb_doc *)0x110851;
  compaction_daemon_test();
LAB_00110851:
  pfStack_14d30 = (fdb_doc *)0x110856;
  compaction_daemon_test();
LAB_00110856:
  pfStack_14d30 = (fdb_doc *)0x11085b;
  compaction_daemon_test();
LAB_0011085b:
  pfStack_14d30 = (fdb_doc *)0x110860;
  compaction_daemon_test();
LAB_00110860:
  pfStack_14d30 = (fdb_doc *)0x110865;
  compaction_daemon_test();
LAB_00110865:
  pfStack_14d30 = (fdb_doc *)0x11086a;
  compaction_daemon_test();
LAB_0011086a:
  pfStack_14d30 = (fdb_doc *)0x11086f;
  compaction_daemon_test();
LAB_0011086f:
  pfStack_14d30 = (fdb_doc *)0x110874;
  compaction_daemon_test();
LAB_00110874:
  pfStack_14d30 = (fdb_doc *)0x110879;
  compaction_daemon_test();
LAB_00110879:
  pfStack_14d30 = (fdb_doc *)0x11087e;
  compaction_daemon_test();
LAB_0011087e:
  pfStack_14d30 = (fdb_doc *)0x110883;
  compaction_daemon_test();
LAB_00110883:
  pfStack_14d30 = (fdb_doc *)0x110888;
  compaction_daemon_test();
LAB_00110888:
  pfStack_14d30 = (fdb_doc *)0x11088d;
  compaction_daemon_test();
LAB_0011088d:
  pfStack_14d30 = (fdb_doc *)0x110892;
  compaction_daemon_test();
LAB_00110892:
  pfStack_14d30 = (fdb_doc *)0x110897;
  compaction_daemon_test();
LAB_00110897:
  pfStack_14d30 = (fdb_doc *)0x11089c;
  compaction_daemon_test();
LAB_0011089c:
  pfStack_14d30 = (fdb_doc *)0x1108a1;
  compaction_daemon_test();
LAB_001108a1:
  pfStack_14d30 = (fdb_doc *)0x1108a6;
  compaction_daemon_test();
LAB_001108a6:
  pfStack_14d30 = (fdb_doc *)0x1108ab;
  compaction_daemon_test();
LAB_001108ab:
  pfStack_14d30 = (fdb_doc *)0x1108b0;
  compaction_daemon_test();
LAB_001108b0:
  pfStack_14d30 = (fdb_doc *)0x1108b5;
  compaction_daemon_test();
LAB_001108b5:
  pfStack_14d30 = (fdb_doc *)0x1108ba;
  compaction_daemon_test();
LAB_001108ba:
  pfStack_14d30 = (fdb_doc *)0x1108bf;
  compaction_daemon_test();
LAB_001108bf:
  pfStack_14d30 = (fdb_doc *)0x1108c4;
  compaction_daemon_test();
LAB_001108c4:
  pfStack_14d30 = (fdb_doc *)0x1108c9;
  compaction_daemon_test();
LAB_001108c9:
  pfStack_14d30 = (fdb_doc *)0x1108ce;
  compaction_daemon_test();
LAB_001108ce:
  pfStack_14d30 = (fdb_doc *)0x1108d3;
  compaction_daemon_test();
LAB_001108d3:
  pfStack_14d30 = (fdb_doc *)0x1108d8;
  compaction_daemon_test();
LAB_001108d8:
  pfStack_14d30 = (fdb_doc *)0x1108dd;
  compaction_daemon_test();
LAB_001108dd:
  pfStack_14d30 = (fdb_doc *)0x1108e2;
  compaction_daemon_test();
LAB_001108e2:
  pfStack_14d30 = (fdb_doc *)0x1108e7;
  compaction_daemon_test();
LAB_001108e7:
  pfStack_14d30 = (fdb_doc *)0x1108ec;
  compaction_daemon_test();
LAB_001108ec:
  pfStack_14d30 = (fdb_doc *)0x1108f1;
  compaction_daemon_test();
LAB_001108f1:
  pfStack_14d30 = (fdb_doc *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_14ec8 = (fdb_doc *)0x110916;
  aStack_14d58 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
  pfStack_14d50 = unaff_R12;
  pcStack_14d48 = unaff_R13;
  pfStack_14d40 = pfVar8;
  ppfStack_14d38 = (fdb_doc **)_Var15._M_i;
  pfStack_14d30 = pfVar10;
  gettimeofday(&tStack_14e78,(__timezone_ptr_t)0x0);
  pfStack_14ec8 = (fdb_doc *)0x11091b;
  memleak_start();
  pfStack_14ec8 = (fdb_doc *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_14ec8 = (fdb_doc *)0x110934;
  fdb_get_default_config();
  uStack_14e22 = 1;
  uStack_14e18._0_2_ = 1;
  uStack_14e18._2_2_ = 0;
  uStack_14e18._4_4_ = 0;
  pfStack_14ec8 = (fdb_doc *)0x110955;
  fVar2 = fdb_open(&pfStack_14eb8,"compact_test",(fdb_config *)(auStack_14e68 + 0x18));
  pfVar13 = (fdb_config *)(auStack_14e68 + 0x18);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar13 = (fdb_config *)auStack_14e68;
    pfStack_14ec8 = (fdb_doc *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_14ec8 = (fdb_doc *)0x11097c;
    fVar2 = fdb_kvs_open_default(pfStack_14eb8,&pfStack_14eb0,(fdb_kvs_config *)pfVar13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_14ec8 = (fdb_doc *)0x110993;
    gettimeofday(&tStack_14e88,(__timezone_ptr_t)0x0);
    pfStack_14ec8 = (fdb_doc *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar11 & 0xffffffff);
    tVar16.tv_usec = tStack_14e88.tv_usec;
    tVar16.tv_sec = tStack_14e88.tv_sec;
    unaff_R13 = acStack_14e97;
    pfVar10 = (fdb_doc *)0x0;
    do {
      iVar3 = (int)pfVar10;
      pfStack_14ec8 = (fdb_doc *)0x1109c4;
      sprintf(unaff_R13,"%d",pfVar10);
      unaff_R12 = pfStack_14eb0;
      pfStack_14ec8 = (fdb_doc *)0x1109d1;
      sVar4 = strlen(unaff_R13);
      pfStack_14ec8 = (fdb_doc *)0x1109ec;
      fVar2 = fdb_set_kv(unaff_R12,unaff_R13,sVar4,"value",5);
      pfVar13 = (fdb_config *)tStack_14e88.tv_sec;
      _Var15._M_i = tStack_14e88.tv_usec;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_14ec8 = (fdb_doc *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_14ec8 = (fdb_doc *)0x110a00;
      fVar2 = fdb_commit(pfStack_14eb8,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_14ec8 = (fdb_doc *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_14ec8 = (fdb_doc *)0x110a14;
      gettimeofday((timeval *)&tStack_14ea8,(__timezone_ptr_t)0x0);
      pfStack_14ec8 = (fdb_doc *)0x110a29;
      tVar17 = _utime_gap(tVar16,tStack_14ea8);
    } while (((fdb_kvs_handle *)tVar17.tv_sec < pcVar11) &&
            (pfVar10 = (fdb_doc *)(ulong)(iVar3 + 1), iVar3 != 99999));
    pfStack_14ec8 = (fdb_doc *)0x110a49;
    fVar2 = fdb_close(pfStack_14eb8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_14ec8 = (fdb_doc *)0x110a52;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_14ec8 = (fdb_doc *)0x110a5b;
      memleak_end();
      pcVar11 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar11 = "%s FAILED\n";
      }
      pfStack_14ec8 = (fdb_doc *)0x110a8c;
      fprintf(_stderr,pcVar11,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_14ec8 = (fdb_doc *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_14ec8 = (fdb_doc *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_14ec8 = (fdb_doc *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_14ec8 = (fdb_doc *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_14ef0 = (fdb_kvs_handle *)pcVar11;
  pfStack_14ee8 = unaff_R12;
  pcStack_14ee0 = unaff_R13;
  pfStack_14ed8 = pfVar13;
  ppfStack_14ed0 = (fdb_doc **)_Var15._M_i;
  pfStack_14ec8 = pfVar10;
  gettimeofday(&tStack_151f8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_15268._32_8_ = (btree *)0x0;
  auStack_15268._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_14fe8.wal_threshold = 0x1000;
  fStack_14fe8.compaction_mode = '\x01';
  fStack_14fe8.compaction_threshold = '\n';
  fStack_14fe8.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar8 = (fdb_kvs_handle *)&pfStack_15288;
  kvs_config = (fdb_file_info *)0x1;
  fVar2 = fdb_open_custom_cmp((fdb_file_handle **)pfVar8,"compact_test",&fStack_14fe8,1,
                              (char **)(auStack_15268 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_15268 + 0x18),(void **)0x0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_15268._16_8_ = afStack_151e8[0].doc_count;
    auStack_15268._0_8_ = afStack_151e8[0].filename;
    auStack_15268._8_8_ = afStack_151e8[0].new_filename;
    info_00 = (fdb_file_info *)auStack_15280;
    pfVar8 = pfStack_15288;
    fVar2 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_15288,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_15268);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_15270;
    kvs_config = (fdb_file_info *)auStack_15268;
    pfVar8 = pfStack_15288;
    fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_15288,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar6 = 0;
    do {
      sprintf((char *)afStack_151e8,"key%06d",uVar6);
      sprintf((char *)afStack_150e8,"body%06d",uVar6);
      pfVar8 = (fdb_kvs_handle *)auStack_15280._0_8_;
      sVar4 = strlen((char *)afStack_151e8);
      sVar5 = strlen((char *)afStack_150e8);
      kvs_config = afStack_150e8;
      info_00 = afStack_151e8;
      fVar2 = fdb_set_kv(pfVar8,afStack_151e8,sVar4,afStack_150e8,sVar5);
      handle = auStack_15270;
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar4 = strlen((char *)afStack_151e8);
      sVar5 = strlen((char *)afStack_150e8);
      kvs_config = afStack_150e8;
      info_00 = afStack_151e8;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_151e8,sVar4,afStack_150e8,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar8 = (fdb_kvs_handle *)handle;
        goto LAB_00110e9b;
      }
      uVar12 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar12;
    } while (uVar12 != 10000);
    kvs_config = (fdb_file_info *)auStack_15268;
    auStack_15268._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_15280 + 8);
    pfVar8 = pfStack_15288;
    fVar2 = fdb_kvs_open((fdb_file_handle *)pfStack_15288,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_151e8;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config = afStack_150e8;
    sprintf((char *)kvs_config,"body%06d",0);
    sVar4 = strlen((char *)info_00);
    sVar5 = strlen((char *)kvs_config);
    fVar2 = fdb_set_kv((fdb_kvs_handle *)auStack_15280._8_8_,info_00,sVar4,kvs_config,sVar5);
    pfVar8 = (fdb_kvs_handle *)auStack_15280._8_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_15288;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15288,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar6 = 0;
    uVar14 = 0;
    do {
      sprintf((char *)afStack_151e8,"key%06d",uVar14);
      sprintf((char *)afStack_150e8,"body%06d",uVar14);
      pfVar8 = (fdb_kvs_handle *)auStack_15280._0_8_;
      sVar4 = strlen((char *)afStack_151e8);
      sVar5 = strlen((char *)afStack_150e8);
      kvs_config = afStack_150e8;
      info_00 = afStack_151e8;
      fVar2 = fdb_set_kv(pfVar8,afStack_151e8,sVar4,afStack_150e8,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_15268 + 0x28);
      pfVar8 = pfStack_15288;
      fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15288,info_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar6 < uStack_15218) {
        uVar6 = uStack_15218;
      }
      uVar12 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar12;
    } while (uVar12 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_15288;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_15288,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_15268 + 0x28);
    pfVar8 = pfStack_15288;
    fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15288,info_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar6 < uStack_15218) {
      uVar6 = uStack_15218;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar6);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_15268 + 0x28);
      pfVar8 = pfStack_15288;
      fVar2 = fdb_get_file_info((fdb_file_handle *)pfStack_15288,
                                (fdb_file_info *)(auStack_15268 + 0x28));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar6 <= uStack_15218);
    fVar2 = fdb_close((fdb_file_handle *)pfStack_15288);
    pfVar8 = pfStack_15288;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_shutdown();
      pfVar8 = pfStack_15288;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar11 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar11 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar11,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config) {
    memcmp(pfVar8,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config) {
    kvs_config = info_00;
  }
  memcmp(pfVar8,__s2,(size_t)kvs_config);
  return;
}

Assistant:

void db_compact_overwrite()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 30;
    fdb_file_handle *dbfile, *dbfile2;
    fdb_kvs_handle *db, *db2;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_doc **doc2 = alca(fdb_doc *, 2*n);
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_info kvs_info;
    fdb_kvs_config kvs_config;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 16777216;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // write to db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // Open the empty db with future compact name
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // write to db2
    for (i=0;i < 2*n;++i){
        sprintf(keybuf, "k2ey%d", i);
        sprintf(metabuf, "m2eta%d", i);
        sprintf(bodybuf, "b2ody%d", i);
        fdb_doc_create(&doc2[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db2, doc2[i]);
    }
    fdb_commit(dbfile2, FDB_COMMIT_NORMAL);


    // verify db2 seqnum and close
    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);

    // compact db1
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db1
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen db1
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // read db1
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // reopen db2
    fdb_open(&dbfile2, "./compact_test1.1", &fconfig);
    fdb_kvs_open(dbfile2, &db2, NULL, &kvs_config);
    status = fdb_set_log_callback(db2, logCallbackFunc,
                                  (void *) "db_destroy_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_get_kvs_info(db2, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == (uint64_t)2*n);

    // read db2
    for (i=0;i<2*n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc2[i]->key, doc2[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(!memcmp(rdoc->meta, doc2[i]->meta, rdoc->metalen));
        TEST_CHK(!memcmp(rdoc->body, doc2[i]->body, rdoc->bodylen));
        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
        fdb_doc_free(doc2[i]);
    }
    for (i=n;i<2*n;++i){
        fdb_doc_free(doc2[i]);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_kvs_close(db2);
    fdb_close(dbfile2);


    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact overwrite");
}